

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

int doctest::anon_unknown_14::wildcmp(char *str,char *wild,bool caseSensitive)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *local_38;
  char *mp;
  char *cp;
  char *pcStack_20;
  bool caseSensitive_local;
  char *wild_local;
  char *str_local;
  
  pcStack_20 = wild;
  wild_local = str;
  while( true ) {
    bVar3 = false;
    if (*wild_local != '\0') {
      bVar3 = *pcStack_20 != '*';
    }
    local_38 = wild;
    mp = str;
    if (!bVar3) break;
    if (caseSensitive) {
      if (*pcStack_20 != *wild_local) {
LAB_00113dfc:
        if (*pcStack_20 != '?') {
          return 0;
        }
      }
    }
    else {
      iVar1 = tolower((int)*pcStack_20);
      iVar2 = tolower((int)*wild_local);
      if (iVar1 != iVar2) goto LAB_00113dfc;
    }
    pcStack_20 = pcStack_20 + 1;
    wild_local = wild_local + 1;
  }
  do {
    while( true ) {
      while( true ) {
        if (*wild_local == '\0') {
          for (; *pcStack_20 == '*'; pcStack_20 = pcStack_20 + 1) {
          }
          return (uint)((*pcStack_20 != '\0' ^ 0xffU) & 1);
        }
        if (*pcStack_20 != '*') break;
        local_38 = pcStack_20 + 1;
        if (pcStack_20[1] == '\0') {
          return 1;
        }
        mp = wild_local + 1;
        pcStack_20 = local_38;
      }
      if (caseSensitive) break;
      iVar1 = tolower((int)*pcStack_20);
      iVar2 = tolower((int)*wild_local);
      if (iVar1 != iVar2) goto LAB_00113ec4;
LAB_00113ed0:
      pcStack_20 = pcStack_20 + 1;
      wild_local = wild_local + 1;
    }
    if (*pcStack_20 == *wild_local) goto LAB_00113ed0;
LAB_00113ec4:
    if (*pcStack_20 == '?') goto LAB_00113ed0;
    pcStack_20 = local_38;
    wild_local = mp;
    mp = mp + 1;
  } while( true );
}

Assistant:

int wildcmp(const char* str, const char* wild, bool caseSensitive) {
        const char* cp = str;
        const char* mp = wild;

        while((*str) && (*wild != '*')) {
            if((caseSensitive ? (*wild != *str) : (tolower(*wild) != tolower(*str))) &&
               (*wild != '?')) {
                return 0;
            }
            wild++;
            str++;
        }

        while(*str) {
            if(*wild == '*') {
                if(!*++wild) {
                    return 1;
                }
                mp = wild;
                cp = str + 1;
            } else if((caseSensitive ? (*wild == *str) : (tolower(*wild) == tolower(*str))) ||
                      (*wild == '?')) {
                wild++;
                str++;
            } else {
                wild = mp;   //!OCLINT parameter reassignment
                str  = cp++; //!OCLINT parameter reassignment
            }
        }

        while(*wild == '*') {
            wild++;
        }
        return !*wild;
    }